

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_warningUnrequiredCircularDependencyComponent_Test::
~Importer_warningUnrequiredCircularDependencyComponent_Test
          (Importer_warningUnrequiredCircularDependencyComponent_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, warningUnrequiredCircularDependencyComponent)
{
    auto parser = libcellml::Parser::create();
    auto importer = libcellml::Importer::create();
    auto model = parser->parseModel(fileContents("importer/master1.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_FALSE(model->hasUnresolvedImports());

    // Expect no issues, as the circular component dependency is not instantiated.
    EXPECT_EQ(size_t(0), importer->issueCount());
}